

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<float,_4> __thiscall
tcu::select<float,4>(tcu *this,float trueVal,float falseVal,Vector<bool,_4> *cond)

{
  float fVar1;
  int i;
  long lVar2;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  Vector<float,_4> VVar4;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    fVar1 = trueVal;
    if (cond->m_data[lVar2] == false) {
      fVar1 = falseVal;
    }
    uVar3 = (ulong)(uint)fVar1;
    *(float *)(this + lVar2 * 4) = fVar1;
  }
  VVar4.m_data[2] = falseVal;
  VVar4.m_data[0] = (float)(int)uVar3;
  VVar4.m_data[1] = (float)(int)(uVar3 >> 0x20);
  VVar4.m_data[3] = 0.0;
  return (Vector<float,_4>)VVar4.m_data;
}

Assistant:

inline Vector<T, Size> select (T trueVal, T falseVal, const Vector<bool, Size>& cond)
{
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res[i] = cond[i] ? trueVal : falseVal;
	return res;
}